

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qbuffer.cpp
# Opt level: O1

void QBuffer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QObjectData *pQVar1;
  QObject *this;
  
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  pQVar1 = (_o->d_ptr).d;
  this = pQVar1->q_ptr;
  QIODevice::bytesWritten((QIODevice *)this,(qint64)pQVar1[5].children.d.d);
  pQVar1[5].children.d.d = (Data *)0x0;
  QIODevice::readyRead((QIODevice *)this);
  *(undefined1 *)((long)&pQVar1[5].children.d.ptr + 4) = 0;
  return;
}

Assistant:

void QBuffer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QBuffer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->d_func()->_q_emitSignals(); break;
        default: ;
        }
    }
    (void)_a;
}